

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O1

JSON __thiscall
QPDFJob::json_schema
          (QPDFJob *this,int json_version,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *keys)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  element_type *peVar2;
  const_iterator cVar3;
  long *plVar4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_14;
  string *key;
  char *pcVar7;
  bool bVar8;
  bool bVar9;
  JSON JVar10;
  JSON page;
  string MODIFY_ANNOTATIONS;
  JSON objectinfo;
  JSON acroform;
  JSON outlines;
  JSON encrypt;
  JSON j_params;
  undefined1 local_1f8 [32];
  string local_1d8;
  undefined1 local_1b8 [32];
  undefined1 local_198 [32];
  undefined1 local_178 [32];
  undefined1 local_158 [32];
  undefined1 local_138 [32];
  string *local_118;
  undefined1 local_110 [32];
  undefined1 local_f0 [32];
  undefined1 local_d0 [32];
  JSON local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  JSON local_80;
  JSON local_70;
  JSON local_60;
  JSON local_50;
  JSON local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  
  JSON::makeDictionary();
  peVar2 = (element_type *)(local_158 + 0x10);
  local_158._0_8_ = peVar2;
  local_118 = (string *)this;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"version","");
  paVar1 = &local_1d8.field_2;
  local_1d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1d8,"JSON format serial number; increased for non-compatible changes",
             "");
  JSON::makeString((JSON *)local_1f8,&local_1d8);
  JSON::addDictionaryMember(&local_40,(string *)this,(JSON *)local_158);
  if (local_40.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._8_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if ((element_type *)local_158._0_8_ != peVar2) {
    operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
  }
  local_158._0_8_ = peVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"parameters","");
  local_1d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1d8,
             "{\n  \"decodelevel\": \"decode level used to determine stream filterability\"\n}","");
  JSON::parse((JSON *)local_1f8,&local_1d8);
  JSON::addDictionaryMember(&local_70,(string *)this,(JSON *)local_158);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._8_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if ((element_type *)local_158._0_8_ != peVar2) {
    operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
  }
  if (keys == (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x0) {
    bVar8 = true;
  }
  else {
    bVar8 = (keys->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0;
  }
  if (json_version == 1) {
    bVar9 = true;
    if (!bVar8) {
      local_158._0_8_ = peVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"objects","");
      cVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&keys->_M_t,(key_type *)local_158);
      bVar9 = (_Rb_tree_header *)cVar3._M_node != &(keys->_M_t)._M_impl.super__Rb_tree_header;
      if ((element_type *)local_158._0_8_ != peVar2) {
        operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
      }
    }
    if (bVar9) {
      local_1d8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"objects","");
      local_1f8._0_8_ = (element_type *)(local_1f8 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1f8,
                 "{\n  \"<n n R|trailer>\": \"json representation of object\"\n}","");
      JSON::parse((JSON *)local_1b8,(string *)local_1f8);
      JSON::addDictionaryMember(&local_50,local_118,(JSON *)&local_1d8);
      if (local_50.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_50.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_);
      }
      if ((element_type *)local_1f8._0_8_ != (element_type *)(local_1f8 + 0x10)) {
        operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != paVar1) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
    }
    bVar9 = true;
    if (!bVar8) {
      local_1d8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"objectinfo","");
      cVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&keys->_M_t,&local_1d8);
      bVar9 = (_Rb_tree_header *)cVar3._M_node != &(keys->_M_t)._M_impl.super__Rb_tree_header;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != paVar1) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
    }
    key = local_118;
    if (bVar9) {
      local_1f8._0_8_ = (element_type *)(local_1f8 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"objectinfo","");
      local_1b8._0_8_ = (element_type *)(local_1b8 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b8,
                 "{\n  \"<object-id>\": {\n    \"stream\": {\n      \"filter\": \"if stream, its filters, otherwise null\",\n      \"is\": \"whether the object is a stream\",\n      \"length\": \"if stream, its length, otherwise null\"\n    }\n  }\n}"
                 ,"");
      JSON::parse((JSON *)local_198,(string *)local_1b8);
      JSON::addDictionaryMember((JSON *)local_138,key,(JSON *)local_1f8);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_);
      }
      if ((element_type *)local_1b8._0_8_ != (element_type *)(local_1b8 + 0x10)) {
        operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
      }
      if ((element_type *)local_1f8._0_8_ != (element_type *)(local_1f8 + 0x10)) {
        operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_);
      }
    }
  }
  else {
    bVar9 = true;
    if (!bVar8) {
      local_158._0_8_ = peVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"qpdf","");
      cVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&keys->_M_t,(key_type *)local_158);
      bVar9 = (_Rb_tree_header *)cVar3._M_node != &(keys->_M_t)._M_impl.super__Rb_tree_header;
      if ((element_type *)local_158._0_8_ != peVar2) {
        operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
      }
    }
    key = local_118;
    if (bVar9) {
      local_1d8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"qpdf","");
      local_1f8._0_8_ = (element_type *)(local_1f8 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1f8,
                 "[{\n  \"jsonversion\": \"numeric JSON version\",\n  \"pdfversion\": \"PDF version as x.y\",\n  \"pushedinheritedpageresources\": \"whether inherited attributes were pushed to the page level\",\n  \"calledgetallpages\": \"whether getAllPages was called\",\n  \"maxobjectid\": \"highest object ID in output, ignored on input\"\n},\n{\n  \"<obj:n n R|trailer>\": \"json representation of object\"\n}]"
                 ,"");
      JSON::parse((JSON *)local_1b8,(string *)local_1f8);
      JSON::addDictionaryMember(&local_60,key,(JSON *)&local_1d8);
      if (local_60.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_60.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_);
      }
      if ((element_type *)local_1f8._0_8_ != (element_type *)(local_1f8 + 0x10)) {
        operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != paVar1) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
    }
  }
  bVar9 = true;
  if (!bVar8) {
    local_1f8._0_8_ = local_1f8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"pages","");
    cVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&keys->_M_t,(key_type *)local_1f8);
    bVar9 = (_Rb_tree_header *)cVar3._M_node != &(keys->_M_t)._M_impl.super__Rb_tree_header;
    if ((element_type *)local_1f8._0_8_ != (element_type *)(local_1f8 + 0x10)) {
      operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
    }
  }
  if (bVar9) {
    local_1b8._0_8_ = (element_type *)(local_1b8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"pages","");
    local_138._0_8_ = (element_type *)(local_138 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_138,
               "[\n  {\n    \"contents\": [\n      \"reference to each content stream\"\n    ],\n    \"images\": [\n      {\n        \"bitspercomponent\": \"bits per component\",\n        \"colorspace\": \"color space\",\n        \"decodeparms\": [\n          \"decode parameters for image data\"\n        ],\n        \"filter\": [\n          \"filters applied to image data\"\n        ],\n        \"filterable\": \"whether image data can be decoded using the decode level qpdf was invoked with\",\n        \"height\": \"image height\",\n        \"name\": \"name of image in XObject table\",\n        \"object\": \"reference to image stream\",\n        \"width\": \"image width\"\n      }\n    ],\n    \"label\": \"page label dictionary, or null if none\",\n    \"object\": \"reference to original page object\",\n    \"outlines\": [\n      {\n        \"dest\": \"outline destination dictionary\",\n        \"object\": \"reference to outline that targets this page\",\n        \"title\": \"outline title\"\n      }\n    ],\n    \"pageposfrom1\": \"position of page in document numbering from 1\"\n  }\n]"
               ,"");
    JSON::parse((JSON *)local_178,(string *)local_138);
    JSON::addDictionaryMember((JSON *)local_198,key,(JSON *)local_1b8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_);
    }
    if ((element_type *)local_138._0_8_ != (element_type *)(local_138 + 0x10)) {
      operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
    }
    if ((element_type *)local_1b8._0_8_ != (element_type *)(local_1b8 + 0x10)) {
      operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_);
    }
  }
  bVar9 = true;
  if (!bVar8) {
    local_1b8._0_8_ = local_1b8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"pagelabels","");
    cVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&keys->_M_t,(key_type *)local_1b8);
    bVar9 = (_Rb_tree_header *)cVar3._M_node != &(keys->_M_t)._M_impl.super__Rb_tree_header;
    if ((element_type *)local_1b8._0_8_ != (element_type *)(local_1b8 + 0x10)) {
      operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
    }
  }
  if (bVar9) {
    local_138._0_8_ = (element_type *)(local_138 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"pagelabels","");
    local_198._0_8_ = (element_type *)(local_198 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_198,
               "[\n  {\n    \"index\": \"starting page position starting from zero\",\n    \"label\": \"page label dictionary\"\n  }\n]"
               ,"");
    JSON::parse((JSON *)local_f0,(string *)local_198);
    JSON::addDictionaryMember((JSON *)local_178,key,(JSON *)local_138);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._8_8_);
    }
    if ((element_type *)local_198._0_8_ != (element_type *)(local_198 + 0x10)) {
      operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
    }
    if ((element_type *)local_138._0_8_ != (element_type *)(local_138 + 0x10)) {
      operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_);
    }
  }
  bVar9 = true;
  if (!bVar8) {
    local_138._0_8_ = local_138 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"outlines","");
    cVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&keys->_M_t,(key_type *)local_138);
    bVar9 = (_Rb_tree_header *)cVar3._M_node != &(keys->_M_t)._M_impl.super__Rb_tree_header;
    if ((element_type *)local_138._0_8_ != (element_type *)(local_138 + 0x10)) {
      operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
    }
  }
  if (bVar9) {
    local_198._0_8_ = (element_type *)(local_198 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"outlines","");
    local_178._0_8_ = (element_type *)(local_178 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_178,
               "[\n  {\n    \"dest\": \"outline destination dictionary\",\n    \"destpageposfrom1\": \"position of destination page in document numbered from 1; null if not known\",\n    \"kids\": \"array of descendent outlines\",\n    \"object\": \"reference to this outline\",\n    \"open\": \"whether the outline is displayed expanded\",\n    \"title\": \"outline title\"\n  }\n]"
               ,"");
    JSON::parse((JSON *)local_110,(string *)local_178);
    JSON::addDictionaryMember((JSON *)local_f0,key,(JSON *)local_198);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._8_8_);
    }
    if ((element_type *)local_178._0_8_ != (element_type *)(local_178 + 0x10)) {
      operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
    }
    if ((element_type *)local_198._0_8_ != (element_type *)(local_198 + 0x10)) {
      operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._8_8_);
    }
  }
  bVar9 = true;
  if (!bVar8) {
    local_198._0_8_ = local_198 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"acroform","");
    cVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&keys->_M_t,(key_type *)local_198);
    bVar9 = (_Rb_tree_header *)cVar3._M_node != &(keys->_M_t)._M_impl.super__Rb_tree_header;
    if ((element_type *)local_198._0_8_ != (element_type *)(local_198 + 0x10)) {
      operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
    }
  }
  peVar2 = (element_type *)(local_178 + 0x10);
  if (bVar9) {
    local_178._0_8_ = peVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"acroform","");
    local_f0._0_8_ = (element_type *)(local_f0 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_f0,
               "{\n  \"fields\": [\n    {\n      \"alternativename\": \"alternative name of field -- this is the one usually shown to users\",\n      \"annotation\": {\n        \"annotationflags\": \"annotation flags from /F -- see pdf_annotation_flag_e in qpdf/Constants.h\",\n        \"appearancestate\": \"appearance state -- can be used to determine value for checkboxes and radio buttons\",\n        \"object\": \"reference to the annotation object\"\n      },\n      \"choices\": \"for choices fields, the list of choices presented to the user\",\n      \"defaultvalue\": \"default value of field\",\n      \"fieldflags\": \"form field flags from /Ff -- see pdf_form_field_flag_e in qpdf/Constants.h\",\n      \"fieldtype\": \"field type\",\n      \"fullname\": \"full name of field\",\n      \"ischeckbox\": \"whether field is a checkbox\",\n      \"ischoice\": \"whether field is a list, combo, or dropdown\",\n      \"isradiobutton\": \"whether field is a radio button -- buttons in a single group share a parent\",\n      \"istext\": \"whether field is a text field\",\n      \"mappingname\": \"mapping name of field\",\n      \"object\": \"reference to this form field\",\n      \"pageposfrom1\": \"position of containing page numbered from 1\",\n      \"parent\": \"reference to this field\'s parent\",\n      \"partialname\": \"partial name of field\",\n      \"quadding\": \"field quadding -- number indicating left, center, or right\",\n      \"value\": \"value of field\"\n    }\n  ],\n  \"hasacroform\": \"whether the document has interactive forms\",\n  \"needappearances\": \"whether the form fields\' appearance streams need to be regenerated\"\n}"
               ,"");
    JSON::parse((JSON *)local_d0,(string *)local_f0);
    JSON::addDictionaryMember((JSON *)local_110,key,(JSON *)local_178);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._8_8_);
    }
    if ((element_type *)local_f0._0_8_ != (element_type *)(local_f0 + 0x10)) {
      operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
    }
    if ((element_type *)local_178._0_8_ != peVar2) {
      operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._8_8_);
    }
  }
  pcVar7 = "modifyannotations";
  if (json_version == 1) {
    pcVar7 = "moddifyannotations";
  }
  local_178._0_8_ = peVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_178,pcVar7,pcVar7 + (ulong)(json_version == 1) + 0x11);
  bVar9 = true;
  _Var6._M_pi = extraout_RDX;
  if (!bVar8) {
    local_f0._0_8_ = local_f0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"encrypt","");
    cVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&keys->_M_t,(key_type *)local_f0);
    bVar9 = (_Rb_tree_header *)cVar3._M_node != &(keys->_M_t)._M_impl.super__Rb_tree_header;
    _Var6._M_pi = extraout_RDX_00;
    if ((element_type *)local_f0._0_8_ != (element_type *)(local_f0 + 0x10)) {
      operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
      _Var6._M_pi = extraout_RDX_01;
    }
  }
  if (bVar9) {
    local_110._0_8_ = (element_type *)(local_110 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"encrypt","");
    std::operator+(&local_a0,
                   "{\n  \"capabilities\": {\n    \"accessibility\": \"allow extraction for accessibility?\",\n    \"extract\": \"allow extraction?\",\n    \""
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_a0);
    peVar5 = (element_type *)(plVar4 + 2);
    if ((element_type *)*plVar4 == peVar5) {
      local_d0._16_8_ =
           (peVar5->value)._M_t.
           super___uniq_ptr_impl<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_>._M_t.
           super__Tuple_impl<0UL,_JSON::JSON_value_*,_std::default_delete<JSON::JSON_value>_>.
           super__Head_base<0UL,_JSON::JSON_value_*,_false>._M_head_impl;
      local_d0._24_8_ = plVar4[3];
      local_d0._0_8_ = (element_type *)(local_d0 + 0x10);
    }
    else {
      local_d0._16_8_ =
           (peVar5->value)._M_t.
           super___uniq_ptr_impl<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_>._M_t.
           super__Tuple_impl<0UL,_JSON::JSON_value_*,_std::default_delete<JSON::JSON_value>_>.
           super__Head_base<0UL,_JSON::JSON_value_*,_false>._M_head_impl;
      local_d0._0_8_ = (element_type *)*plVar4;
    }
    local_d0._8_8_ = plVar4[1];
    *plVar4 = (long)peVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    JSON::parse(&local_b0,(string *)local_d0);
    JVar10 = JSON::addDictionaryMember(&local_80,key,(JSON *)local_110);
    _Var6._M_pi = JVar10.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  ._M_pi;
    if (local_b0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var6._M_pi = extraout_RDX_02;
    }
    if ((element_type *)local_d0._0_8_ != (element_type *)(local_d0 + 0x10)) {
      operator_delete((void *)local_d0._0_8_,(ulong)(local_d0._16_8_ + 1));
      _Var6._M_pi = extraout_RDX_03;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      _Var6._M_pi = extraout_RDX_04;
    }
    if ((element_type *)local_110._0_8_ != (element_type *)(local_110 + 0x10)) {
      operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      _Var6._M_pi = extraout_RDX_05;
    }
    if (local_80.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_80.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var6._M_pi = extraout_RDX_06;
    }
  }
  bVar9 = true;
  if (!bVar8) {
    local_110._0_8_ = local_110 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"attachments","");
    cVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&keys->_M_t,(key_type *)local_110);
    bVar9 = (_Rb_tree_header *)cVar3._M_node != &(keys->_M_t)._M_impl.super__Rb_tree_header;
    _Var6._M_pi = extraout_RDX_07;
    if ((element_type *)local_110._0_8_ != (element_type *)(local_110 + 0x10)) {
      operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      _Var6._M_pi = extraout_RDX_08;
    }
  }
  if (bVar9) {
    local_d0._0_8_ = (element_type *)(local_d0 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"attachments","");
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a0,
               "{\n  \"<attachment-key>\": {\n    \"filespec\": \"object containing the file spec\",\n    \"preferredcontents\": \"most preferred embedded file stream\",\n    \"preferredname\": \"most preferred file name\",\n    \"description\": \"description of attachment\",\n    \"names\": {\n      \"<name-key>\": \"file name for key\"\n    },\n    \"streams\": {\n      \"<stream-key>\": {\n        \"creationdate\": \"ISO-8601 creation date or null\",\n        \"modificationdate\": \"ISO-8601 modification date or null\",\n        \"mimetype\": \"mime type or null\",\n        \"checksum\": \"MD5 checksum or null\"\n      }\n    }\n  }\n}"
               ,"");
    JSON::parse(&local_b0,&local_a0);
    JVar10 = JSON::addDictionaryMember(&local_80,key,(JSON *)local_d0);
    _Var6._M_pi = JVar10.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  ._M_pi;
    if (local_b0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var6._M_pi = extraout_RDX_09;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      _Var6._M_pi = extraout_RDX_10;
    }
    if ((element_type *)local_d0._0_8_ != (element_type *)(local_d0 + 0x10)) {
      operator_delete((void *)local_d0._0_8_,(ulong)(local_d0._16_8_ + 1));
      _Var6._M_pi = extraout_RDX_11;
    }
    if (local_80.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_80.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var6._M_pi = extraout_RDX_12;
    }
  }
  if ((element_type *)local_178._0_8_ != peVar2) {
    operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
    _Var6._M_pi = extraout_RDX_13;
  }
  if (local_70.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var6._M_pi = extraout_RDX_14;
  }
  JVar10.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var6._M_pi;
  JVar10.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)key;
  return (JSON)JVar10.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

JSON
QPDFJob::json_schema(int json_version, std::set<std::string>* keys)
{
    // Style: use all lower-case keys with no dashes or underscores. Choose array or dictionary
    // based on indexing. For example, we use a dictionary for objects because we want to index by
    // object ID and an array for pages because we want to index by position. The pages in the pages
    // array contain references back to the original object, which can be resolved in the objects
    // dictionary. When a PDF construct that maps back to an original object is represented
    // separately, use "object" as the key that references the original object.

    // This JSON object doubles as a schema and as documentation for our JSON output. Any schema
    // mismatch is a bug in qpdf. This helps to enforce our policy of consistently providing a known
    // structure where every documented key will always be present, which makes it easier to consume
    // our JSON. This is discussed in more depth in the manual.
    JSON schema = JSON::makeDictionary();
    schema.addDictionaryMember(
        "version",
        JSON::makeString("JSON format serial number; increased for non-compatible changes"));
    JSON j_params = schema.addDictionaryMember("parameters", JSON::parse(R"({
  "decodelevel": "decode level used to determine stream filterability"
})"));

    bool all_keys = ((keys == nullptr) || keys->empty());

    // The list of selectable top-level keys id duplicated in the following places: job.yml,
    // QPDFJob::json_schema, and QPDFJob::doJSON.
    if (json_version == 1) {
        if (all_keys || keys->count("objects")) {
            schema.addDictionaryMember("objects", JSON::parse(R"({
  "<n n R|trailer>": "json representation of object"
})"));
        }
        if (all_keys || keys->count("objectinfo")) {
            JSON objectinfo = schema.addDictionaryMember("objectinfo", JSON::parse(R"({
  "<object-id>": {
    "stream": {
      "filter": "if stream, its filters, otherwise null",
      "is": "whether the object is a stream",
      "length": "if stream, its length, otherwise null"
    }
  }
})"));
        }
    } else {
        if (all_keys || keys->count("qpdf")) {
            schema.addDictionaryMember("qpdf", JSON::parse(R"([{
  "jsonversion": "numeric JSON version",
  "pdfversion": "PDF version as x.y",
  "pushedinheritedpageresources": "whether inherited attributes were pushed to the page level",
  "calledgetallpages": "whether getAllPages was called",
  "maxobjectid": "highest object ID in output, ignored on input"
},
{
  "<obj:n n R|trailer>": "json representation of object"
}])"));
        }
    }
    if (all_keys || keys->count("pages")) {
        JSON page = schema.addDictionaryMember("pages", JSON::parse(R"([
  {
    "contents": [
      "reference to each content stream"
    ],
    "images": [
      {
        "bitspercomponent": "bits per component",
        "colorspace": "color space",
        "decodeparms": [
          "decode parameters for image data"
        ],
        "filter": [
          "filters applied to image data"
        ],
        "filterable": "whether image data can be decoded using the decode level qpdf was invoked with",
        "height": "image height",
        "name": "name of image in XObject table",
        "object": "reference to image stream",
        "width": "image width"
      }
    ],
    "label": "page label dictionary, or null if none",
    "object": "reference to original page object",
    "outlines": [
      {
        "dest": "outline destination dictionary",
        "object": "reference to outline that targets this page",
        "title": "outline title"
      }
    ],
    "pageposfrom1": "position of page in document numbering from 1"
  }
])"));
    }
    if (all_keys || keys->count("pagelabels")) {
        JSON labels = schema.addDictionaryMember("pagelabels", JSON::parse(R"([
  {
    "index": "starting page position starting from zero",
    "label": "page label dictionary"
  }
])"));
    }
    if (all_keys || keys->count("outlines")) {
        JSON outlines = schema.addDictionaryMember("outlines", JSON::parse(R"([
  {
    "dest": "outline destination dictionary",
    "destpageposfrom1": "position of destination page in document numbered from 1; null if not known",
    "kids": "array of descendent outlines",
    "object": "reference to this outline",
    "open": "whether the outline is displayed expanded",
    "title": "outline title"
  }
])"));
    }
    if (all_keys || keys->count("acroform")) {
        JSON acroform = schema.addDictionaryMember("acroform", JSON::parse(R"({
  "fields": [
    {
      "alternativename": "alternative name of field -- this is the one usually shown to users",
      "annotation": {
        "annotationflags": "annotation flags from /F -- see pdf_annotation_flag_e in qpdf/Constants.h",
        "appearancestate": "appearance state -- can be used to determine value for checkboxes and radio buttons",
        "object": "reference to the annotation object"
      },
      "choices": "for choices fields, the list of choices presented to the user",
      "defaultvalue": "default value of field",
      "fieldflags": "form field flags from /Ff -- see pdf_form_field_flag_e in qpdf/Constants.h",
      "fieldtype": "field type",
      "fullname": "full name of field",
      "ischeckbox": "whether field is a checkbox",
      "ischoice": "whether field is a list, combo, or dropdown",
      "isradiobutton": "whether field is a radio button -- buttons in a single group share a parent",
      "istext": "whether field is a text field",
      "mappingname": "mapping name of field",
      "object": "reference to this form field",
      "pageposfrom1": "position of containing page numbered from 1",
      "parent": "reference to this field's parent",
      "partialname": "partial name of field",
      "quadding": "field quadding -- number indicating left, center, or right",
      "value": "value of field"
    }
  ],
  "hasacroform": "whether the document has interactive forms",
  "needappearances": "whether the form fields' appearance streams need to be regenerated"
})"));
    }
    std::string MODIFY_ANNOTATIONS =
        (json_version == 1 ? "moddifyannotations" : "modifyannotations");
    if (all_keys || keys->count("encrypt")) {
        JSON encrypt = schema.addDictionaryMember("encrypt", JSON::parse(R"({
  "capabilities": {
    "accessibility": "allow extraction for accessibility?",
    "extract": "allow extraction?",
    ")" + MODIFY_ANNOTATIONS + R"(": "allow modifying annotations?",
    "modify": "allow all modifications?",
    "modifyassembly": "allow modifying document assembly?",
    "modifyforms": "allow modifying forms?",
    "modifyother": "allow other modifications?",
    "printhigh": "allow high resolution printing?",
    "printlow": "allow low resolution printing?"
  },
  "encrypted": "whether the document is encrypted",
  "ownerpasswordmatched": "whether supplied password matched owner password; always false for non-encrypted files",
  "recovereduserpassword": "If the owner password was used to recover the user password, reveal user password; otherwise null",
  "parameters": {
    "P": "P value from Encrypt dictionary",
    "R": "R value from Encrypt dictionary",
    "V": "V value from Encrypt dictionary",
    "bits": "encryption key bit length",
    "filemethod": "encryption method for attachments",
    "key": "encryption key; will be null unless --show-encryption-key was specified",
    "method": "overall encryption method: none, mixed, RC4, AESv2, AESv3",
    "streammethod": "encryption method for streams",
    "stringmethod": "encryption method for string"
  },
  "userpasswordmatched": "whether supplied password matched user password; always false for non-encrypted files"
})"));
    }
    if (all_keys || keys->count("attachments")) {
        JSON attachments = schema.addDictionaryMember("attachments", JSON::parse(R"({
  "<attachment-key>": {
    "filespec": "object containing the file spec",
    "preferredcontents": "most preferred embedded file stream",
    "preferredname": "most preferred file name",
    "description": "description of attachment",
    "names": {
      "<name-key>": "file name for key"
    },
    "streams": {
      "<stream-key>": {
        "creationdate": "ISO-8601 creation date or null",
        "modificationdate": "ISO-8601 modification date or null",
        "mimetype": "mime type or null",
        "checksum": "MD5 checksum or null"
      }
    }
  }
})"));
    }
    return schema;
}